

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
BaseState<true>::String
          (BaseState<true> *this,Context<true> *ctx,char *str,SizeType len,bool param_5)

{
  stringstream *psVar1;
  ostream *poVar2;
  uint in_ECX;
  char *in_RDX;
  Context<true> *unaff_retaddr;
  
  psVar1 = Context<true>::error_abi_cxx11_(unaff_retaddr);
  poVar2 = std::operator<<((ostream *)(psVar1 + 0x10),"Unexpected token: string(\'");
  poVar2 = std::operator<<(poVar2,in_RDX);
  poVar2 = std::operator<<(poVar2,"\' len: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ECX);
  std::operator<<(poVar2,")");
  return (BaseState<true> *)0x0;
}

Assistant:

virtual BaseState<audit>* String(Context<audit>& ctx, const char* str, rapidjson::SizeType len, bool)
  {
    ctx.error() << "Unexpected token: string('" << str << "' len: " << len << ")";
    return nullptr;
  }